

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workqueue.h
# Opt level: O0

void pbrt::
     ForAllQueued<pbrt::WavefrontPathIntegrator::SampleSubsurface(int)::__0,pbrt::GetBSSRDFAndProbeRayWorkItem>
               (char *desc,WorkQueue<pbrt::GetBSSRDFAndProbeRayWorkItem> *q,int maxQueued,
               anon_class_8_1_8991fb9c *func)

{
  int64_t in_RCX;
  char *in_stack_00000038;
  int in_stack_00000044;
  char *in_stack_00000048;
  LogLevel in_stack_00000054;
  WorkQueue<pbrt::GetBSSRDFAndProbeRayWorkItem> *in_stack_ffffffffffffff98;
  function<void_(long)> *in_stack_ffffffffffffffa0;
  anon_class_16_2_fc91de78 local_40;
  function<void_(long)> *in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  
  if ((*(byte *)(Options + 10) & 1) != 0) {
    LogFatal(in_stack_00000054,in_stack_00000048,in_stack_00000044,in_stack_00000038);
  }
  WorkQueue<pbrt::GetBSSRDFAndProbeRayWorkItem>::Size(in_stack_ffffffffffffff98);
  std::function<void(long)>::
  function<pbrt::ForAllQueued<pbrt::WavefrontPathIntegrator::SampleSubsurface(int)::__0,pbrt::GetBSSRDFAndProbeRayWorkItem>(char_const*,pbrt::WorkQueue<pbrt::GetBSSRDFAndProbeRayWorkItem>const*,int,pbrt::WavefrontPathIntegrator::SampleSubsurface(int)::__0&&)::_lambda(int)_1_,void>
            (in_stack_ffffffffffffffa0,&local_40);
  ParallelFor(in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::function<void_(long)>::~function((function<void_(long)> *)0x9fd5ec);
  return;
}

Assistant:

void ForAllQueued(const char *desc, const WorkQueue<WorkItem> *q, int maxQueued,
                  F &&func) {
    if (Options->useGPU) {
        // Launch GPU threads to process _q_ using _func_
#ifdef PBRT_BUILD_GPU_RENDERER
        GPUParallelFor(desc, maxQueued, [=] PBRT_GPU(int index) mutable {
            if (index >= q->Size())
                return;
            func((*q)[index]);
        });
#else
        LOG_FATAL("Options->useGPU was set without PBRT_BUILD_GPU_RENDERER enabled");
#endif

    } else {
        // Process _q_ using _func_ with CPU threads
        ParallelFor(0, q->Size(), [&](int index) { func((*q)[index]); });
    }
}